

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

void __thiscall cfd::core::Serializer::Serializer(Serializer *this)

{
  allocator_type local_9;
  
  this->_vptr_Serializer = (_func_int **)&PTR__Serializer_006f3de8;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->buffer_,8,&local_9);
  this->offset_ = 0;
  return;
}

Assistant:

Serializer::Serializer() : buffer_(8), offset_(0) {
  // do nothing
}